

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  ImGuiTabItem *pIVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImGuiShrinkWidthItem *pIVar8;
  ImGuiTabItem *pIVar9;
  ImVec2 size;
  ImGuiID IVar10;
  ImGuiID IVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int section_n;
  ImGuiID IVar23;
  long lVar24;
  ulong uVar25;
  ImGuiTabItem *pIVar26;
  int iVar27;
  int iVar28;
  ImGuiID *pIVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  byte bVar33;
  int tab_n;
  int iVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float local_134;
  float local_11c;
  ImGuiTabBarSection sections [3];
  ImGuiID local_e8;
  int shrink_buffer_indexes [3];
  ImVec2 local_88;
  ImVec4 local_78;
  undefined8 local_68;
  ulong local_60;
  ImVec4 arrow_col;
  
  pIVar19 = GImGui;
  tab_bar->WantLayout = false;
  sections[2].Spacing = 0.0;
  sections[1].Width = 0.0;
  sections[1].Spacing = 0.0;
  sections[2].TabCount = 0;
  sections[2].Width = 0.0;
  sections[0].TabCount = 0;
  sections[0].Width = 0.0;
  sections[0].Spacing = 0.0;
  sections[1].TabCount = 0;
  lVar24 = 0;
  bVar33 = 0;
  uVar30 = 0;
  for (uVar32 = 0; uVar5 = (tab_bar->Tabs).Size, (long)uVar32 < (long)(int)uVar5;
      uVar32 = uVar32 + 1) {
    pIVar26 = (tab_bar->Tabs).Data;
    pIVar29 = (ImGuiID *)((long)&pIVar26->ID + lVar24);
    if ((*(int *)((long)&pIVar26->LastFrameVisible + lVar24) < tab_bar->PrevFrameVisible) ||
       ((&pIVar26->WantClose)[lVar24] == true)) {
      IVar23 = *pIVar29;
      if (tab_bar->VisibleTabId == IVar23) {
        tab_bar->VisibleTabId = 0;
      }
      if (tab_bar->SelectedTabId == IVar23) {
        tab_bar->SelectedTabId = 0;
      }
      if (tab_bar->NextSelectedTabId == IVar23) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (uVar32 != uVar30) {
        *(undefined4 *)((long)&pIVar26[(int)uVar30].BeginOrder + 1) =
             *(undefined4 *)((long)pIVar29 + 0x1f);
        IVar23 = *pIVar29;
        IVar10 = pIVar29[1];
        IVar11 = pIVar29[2];
        IVar12 = pIVar29[3];
        fVar36 = (float)pIVar29[5];
        fVar37 = (float)pIVar29[6];
        IVar13 = pIVar29[7];
        pfVar3 = &pIVar26[(int)uVar30].Offset;
        *pfVar3 = (float)pIVar29[4];
        pfVar3[1] = fVar36;
        pfVar3[2] = fVar37;
        pfVar3[3] = (float)IVar13;
        pIVar26 = pIVar26 + (int)uVar30;
        pIVar26->ID = IVar23;
        pIVar26->Flags = IVar10;
        pIVar26->LastFrameVisible = IVar11;
        pIVar26->LastFrameSelected = IVar12;
        pIVar26 = (tab_bar->Tabs).Data;
      }
      pIVar26[(int)uVar30].IndexDuringLayout = (ImS16)uVar30;
      uVar5 = pIVar26[(int)uVar30].Flags;
      lVar35 = 0;
      if ((uVar5 & 0x40) == 0) {
        lVar35 = (ulong)((char)(byte)uVar5 < '\0') + 1;
      }
      if (0 < (int)uVar30) {
        bVar33 = (pIVar26[(ulong)uVar30 - 1].Flags & 0x40U) == 0 & (byte)uVar5 >> 6 | bVar33 |
                 ((uVar5 & 0xc0) != 0x80 && (pIVar26[(ulong)uVar30 - 1].Flags & 0xc0U) == 0x80);
      }
      sections[lVar35].TabCount = sections[lVar35].TabCount + 1;
      uVar30 = uVar30 + 1;
    }
    lVar24 = lVar24 + 0x24;
  }
  if (uVar5 != uVar30) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,uVar30);
  }
  if (bVar33 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x24,TabItemComparerBySection);
  }
  uVar32 = (ulong)(uint)sections[1].TabCount;
  local_11c = (float)sections[0].TabCount;
  iVar27 = sections[2].TabCount;
  fVar36 = 0.0;
  local_134 = 0.0;
  if (0 < sections[2].TabCount + sections[1].TabCount && 0 < sections[0].TabCount) {
    fVar36 = (pIVar19->Style).ItemInnerSpacing.x;
  }
  sections[0].Spacing = fVar36;
  if (0 < sections[2].TabCount && 0 < sections[1].TabCount) {
    local_134 = (pIVar19->Style).ItemInnerSpacing.x;
  }
  sections[1].Spacing = local_134;
  local_e8 = tab_bar->NextSelectedTabId;
  if (local_e8 != 0) {
    tab_bar->SelectedTabId = local_e8;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar20 = TabBarProcessReorder(tab_bar);
    if ((bVar20) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_e8 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar18 = GImGui;
  local_60 = uVar32;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar6 = GImGui->CurrentWindow;
    fVar37 = (GImGui->Style).FramePadding.y;
    fVar40 = GImGui->FontSize;
    IVar7 = (pIVar6->DC).CursorPos;
    fVar38 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar37;
    (pIVar6->DC).CursorPos.y = fVar38;
    (tab_bar->BarRect).Min.x = fVar40 + fVar37 + (tab_bar->BarRect).Min.x;
    arrow_col.x = (pIVar18->Style).Colors[0].x;
    arrow_col.y = (pIVar18->Style).Colors[0].y;
    uVar14 = (pIVar18->Style).Colors[0].z;
    uVar15 = (pIVar18->Style).Colors[0].w;
    arrow_col.w = (float)uVar15 * 0.5;
    arrow_col.z = (float)uVar14;
    PushStyleColor(0,&arrow_col);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar20 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar20) {
      lVar24 = 0;
      pIVar29 = (ImGuiID *)0x0;
      for (lVar35 = 0; lVar35 < (tab_bar->Tabs).Size; lVar35 = lVar35 + 1) {
        pIVar26 = (tab_bar->Tabs).Data;
        if ((*(byte *)((long)&pIVar26->Flags + lVar24 + 2) & 0x20) == 0) {
          local_78.x = 0.0;
          local_78.y = 0.0;
          bVar20 = Selectable((tab_bar->TabsNames).Buf.Data +
                              *(short *)((long)&pIVar26->NameOffset + lVar24),
                              tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar26->ID + lVar24),0,
                              (ImVec2 *)&local_78);
          if (bVar20) {
            pIVar29 = (ImGuiID *)((long)&pIVar26->ID + lVar24);
          }
        }
        lVar24 = lVar24 + 0x24;
      }
      EndPopup();
      (pIVar6->DC).CursorPos = IVar7;
      if (pIVar29 != (ImGuiID *)0x0) {
        local_e8 = *pIVar29;
        tab_bar->SelectedTabId = local_e8;
      }
    }
    else {
      (pIVar6->DC).CursorPos = IVar7;
    }
  }
  shrink_buffer_indexes[0] = 0;
  iVar27 = iVar27 + (int)local_11c;
  shrink_buffer_indexes[2] = (int)local_11c;
  shrink_buffer_indexes[1] = iVar27;
  ImVector<ImGuiShrinkWidthItem>::resize(&pIVar19->ShrinkWidthBuffer,(tab_bar->Tabs).Size);
  lVar35 = 0;
  bVar20 = false;
  pIVar29 = (ImGuiID *)0x0;
  uVar32 = 0xffffffffffffffff;
  for (lVar24 = 0; iVar34 = (tab_bar->Tabs).Size, lVar24 < iVar34; lVar24 = lVar24 + 1) {
    pIVar26 = (tab_bar->Tabs).Data;
    pIVar1 = (ImGuiID *)((long)&pIVar26->ID + lVar35);
    if (((pIVar29 == (ImGuiID *)0x0) ||
        ((int)pIVar29[3] < *(int *)((long)&pIVar26->LastFrameSelected + lVar35))) &&
       ((*(byte *)((long)&pIVar26->Flags + lVar35 + 2) & 0x20) == 0)) {
      pIVar29 = pIVar1;
    }
    IVar23 = *pIVar1;
    if (IVar23 == tab_bar->SelectedTabId) {
      bVar20 = true;
    }
    if ((local_e8 == 0) && (local_e8 = IVar23, pIVar19->NavJustMovedToId != IVar23)) {
      local_e8 = 0;
    }
    IVar7 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                            *(short *)((long)&pIVar26->NameOffset + lVar35),
                            (*(uint *)((long)&pIVar26->Flags + lVar35) >> 0x14 & 1) == 0);
    fVar37 = IVar7.x;
    *(float *)((long)&pIVar26->ContentWidth + lVar35) = fVar37;
    uVar30 = *(uint *)((long)&pIVar26->Flags + lVar35);
    uVar25 = (ulong)(((char)uVar30 < '\0') + 1);
    if ((uVar30 & 0x40) != 0) {
      uVar25 = 0;
    }
    fVar40 = 0.0;
    if ((int)uVar25 == (int)uVar32) {
      fVar40 = (pIVar19->Style).ItemInnerSpacing.x;
    }
    sections[uVar25].Width = fVar40 + fVar37 + sections[uVar25].Width;
    iVar34 = shrink_buffer_indexes[uVar25];
    shrink_buffer_indexes[uVar25] = iVar34 + 1;
    pIVar8 = (pIVar19->ShrinkWidthBuffer).Data;
    pIVar8[iVar34].Index = (int)lVar24;
    pIVar8[iVar34].Width = fVar37;
    *(float *)((long)&pIVar26->Width + lVar35) = fVar37;
    lVar35 = lVar35 + 0x24;
    uVar32 = uVar25;
  }
  fVar37 = 0.0;
  for (lVar24 = 8; lVar24 != 0x2c; lVar24 = lVar24 + 0xc) {
    fVar37 = fVar37 + *(float *)((long)sections + lVar24 + -4) +
                      *(float *)((long)&sections[0].TabCount + lVar24);
  }
  tab_bar->WidthAllTabsIdeal = fVar37;
  pIVar18 = GImGui;
  fVar40 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar34) && (fVar40 - (tab_bar->BarRect).Min.x < fVar37)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar6 = GImGui->CurrentWindow;
    local_88.x = GImGui->FontSize + -2.0;
    fVar37 = (GImGui->Style).FramePadding.y;
    local_88.y = fVar37 + fVar37 + GImGui->FontSize;
    IVar7 = (pIVar6->DC).CursorPos;
    arrow_col.x = (GImGui->Style).Colors[0].x;
    arrow_col.y = (GImGui->Style).Colors[0].y;
    uVar16 = (GImGui->Style).Colors[0].z;
    uVar17 = (GImGui->Style).Colors[0].w;
    arrow_col.w = (float)uVar17 * 0.5;
    arrow_col.z = (float)uVar16;
    PushStyleColor(0,&arrow_col);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_68._0_4_ = (pIVar18->IO).KeyRepeatDelay;
    local_68._4_4_ = (pIVar18->IO).KeyRepeatRate;
    (pIVar18->IO).KeyRepeatDelay = 0.25;
    (pIVar18->IO).KeyRepeatRate = 0.2;
    fVar37 = (tab_bar->BarRect).Min.x;
    fVar40 = (tab_bar->BarRect).Max.x - (local_88.x + local_88.x);
    uVar30 = -(uint)(fVar40 <= fVar37);
    fVar40 = (float)(uVar30 & (uint)fVar37 | ~uVar30 & (uint)fVar40);
    fVar37 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = fVar40;
    (pIVar6->DC).CursorPos.y = fVar37;
    size.y = local_88.y;
    size.x = local_88.x;
    bVar21 = ArrowButtonEx("##<",0,size,0x410);
    fVar37 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = fVar40 + local_88.x;
    (pIVar6->DC).CursorPos.y = fVar37;
    bVar22 = ArrowButtonEx("##>",1,local_88,0x410);
    iVar34 = -(uint)bVar21;
    if (bVar22) {
      iVar34 = 1;
    }
    PopStyleColor(2);
    (pIVar18->IO).KeyRepeatDelay = (float)(undefined4)local_68;
    (pIVar18->IO).KeyRepeatRate = (float)local_68._4_4_;
    if ((iVar34 == 0) ||
       (pIVar26 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar26 == (ImGuiTabItem *)0x0)
       ) {
      pIVar26 = (ImGuiTabItem *)0x0;
    }
    else {
      pIVar9 = (tab_bar->Tabs).Data;
      uVar32 = ((long)pIVar26 - (long)pIVar9) / 0x24;
      iVar28 = iVar34 + (int)uVar32;
      pIVar26 = (ImGuiTabItem *)0x0;
      while (pIVar26 == (ImGuiTabItem *)0x0) {
        if ((iVar28 < 0) || (iVar31 = iVar28, (tab_bar->Tabs).Size <= iVar28)) {
          iVar31 = (int)uVar32;
        }
        pIVar2 = pIVar9 + iVar31;
        pIVar26 = pIVar2;
        if ((pIVar9[iVar31].Flags & 0x200000) != 0) {
          uVar32 = (ulong)(uint)((int)uVar32 + iVar34);
          iVar28 = iVar28 + iVar34;
          if ((-1 < iVar28) && (pIVar26 = (ImGuiTabItem *)0x0, (tab_bar->Tabs).Size <= iVar28)) {
            pIVar26 = pIVar2;
          }
        }
      }
    }
    (pIVar6->DC).CursorPos = IVar7;
    fVar40 = (tab_bar->BarRect).Max.x - (local_88.x + local_88.x + 1.0);
    (tab_bar->BarRect).Max.x = fVar40;
    if ((pIVar26 != (ImGuiTabItem *)0x0) &&
       (local_e8 = pIVar26->ID, (pIVar26->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_e8;
    }
  }
  fVar37 = sections[0].Width + fVar36 + sections[2].Width + 0.0;
  fVar40 = fVar40 - (tab_bar->BarRect).Min.x;
  if (fVar37 < fVar40) {
    fVar38 = (sections[1].Width + local_134) -
             ((fVar40 - (sections[0].Width + fVar36)) - (sections[2].Width + 0.0));
    if (0.0 <= fVar38) goto LAB_0016098f;
  }
  else {
    fVar38 = fVar37 - fVar40;
LAB_0016098f:
    if ((0.0 < fVar38) && ((fVar40 <= fVar37 || ((tab_bar->Flags & 0x40U) != 0)))) {
      iVar28 = iVar27;
      iVar34 = (int)local_60;
      if (fVar40 <= fVar37) {
        iVar28 = 0;
        iVar34 = iVar27;
      }
      lVar24 = (long)iVar28;
      ShrinkWidths((pIVar19->ShrinkWidthBuffer).Data + lVar24,iVar34,fVar38);
      for (; lVar24 < iVar34 + iVar28; lVar24 = lVar24 + 1) {
        pIVar8 = (pIVar19->ShrinkWidthBuffer).Data;
        iVar27 = (int)pIVar8[lVar24].Width;
        if (-1 < iVar27) {
          fVar37 = (float)iVar27;
          pIVar26 = (tab_bar->Tabs).Data;
          iVar27 = pIVar8[lVar24].Index;
          lVar35 = (ulong)((char)pIVar26[iVar27].Flags < '\0') + 1;
          if ((pIVar26[iVar27].Flags & 0x40U) != 0) {
            lVar35 = 0;
          }
          sections[lVar35].Width = sections[lVar35].Width - (pIVar26[iVar27].Width - fVar37);
          pIVar26[iVar27].Width = fVar37;
        }
      }
    }
  }
  fVar37 = 0.0;
  iVar27 = 0;
  fVar40 = 0.0;
  for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
    fVar38 = fVar40;
    if ((lVar24 == 2) &&
       (fVar38 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[2].Width,
       fVar38 = (float)(~-(uint)(fVar38 <= 0.0) & (uint)fVar38), fVar40 <= fVar38)) {
      fVar38 = fVar40;
    }
    uVar30 = sections[lVar24].TabCount;
    uVar32 = 0;
    if (0 < (int)uVar30) {
      uVar32 = (ulong)uVar30;
    }
    lVar35 = (long)iVar27 * 0x24 + 0x14;
    for (uVar25 = 0; uVar32 != uVar25; uVar25 = uVar25 + 1) {
      pIVar26 = (tab_bar->Tabs).Data;
      *(float *)((long)pIVar26 + lVar35 + -4) = fVar38;
      fVar40 = 0.0;
      if ((long)uVar25 < (long)(int)uVar30 + -1) {
        fVar40 = (pIVar19->Style).ItemInnerSpacing.x;
      }
      fVar38 = fVar38 + fVar40 + *(float *)((long)&pIVar26->ID + lVar35);
      lVar35 = lVar35 + 0x24;
    }
    fVar40 = sections[lVar24].Width + sections[lVar24].Spacing;
    fVar37 = fVar37 + (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
    fVar40 = fVar38 + sections[lVar24].Spacing;
    iVar27 = iVar27 + uVar30;
  }
  tab_bar->WidthAllTabs = fVar37;
  if (bVar20) {
    IVar23 = tab_bar->SelectedTabId;
    if (IVar23 == 0) goto LAB_00160aa2;
  }
  else {
    tab_bar->SelectedTabId = 0;
LAB_00160aa2:
    IVar23 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar23 = 0, pIVar29 != (ImGuiID *)0x0)) {
      IVar23 = *pIVar29;
      tab_bar->SelectedTabId = IVar23;
      local_e8 = IVar23;
    }
  }
  tab_bar->VisibleTabId = IVar23;
  tab_bar->VisibleTabWasSubmitted = false;
  if (((local_e8 != 0) &&
      (pIVar26 = TabBarFindTabByID(tab_bar,local_e8), pIVar26 != (ImGuiTabItem *)0x0)) &&
     ((pIVar26->Flags & 0xc0) == 0)) {
    fVar37 = GImGui->FontSize;
    fVar40 = (tab_bar->BarRect).Max.x;
    fVar38 = (tab_bar->BarRect).Min.x;
    fVar39 = pIVar26->Offset - sections[0].Width;
    iVar27 = (int)(((long)pIVar26 - (long)(tab_bar->Tabs).Data) / 0x24);
    fVar41 = fVar37;
    if (iVar27 < (int)local_11c) {
      fVar41 = -0.0;
    }
    fVar41 = fVar39 - fVar41;
    fVar4 = pIVar26->Width;
    if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar27 + 1) {
      fVar37 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar37 = fVar39 + fVar4 + fVar37;
    if ((fVar41 < tab_bar->ScrollingTarget) ||
       (fVar40 = (((fVar40 - fVar38) - sections[0].Width) - sections[2].Width) - local_134,
       fVar40 <= fVar37 - fVar41)) {
      fVar38 = tab_bar->ScrollingAnim - fVar37;
    }
    else {
      if (fVar37 - fVar40 <= tab_bar->ScrollingTarget) goto LAB_00160c66;
      fVar38 = (fVar41 - fVar40) - tab_bar->ScrollingAnim;
      fVar41 = fVar37 - fVar40;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar38) & (uint)fVar38);
    tab_bar->ScrollingTarget = fVar41;
  }
LAB_00160c66:
  fVar37 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar37;
  fVar40 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar40;
  if ((fVar37 != fVar40) || (NAN(fVar37) || NAN(fVar40))) {
    fVar38 = pIVar19->FontSize;
    fVar41 = fVar38 * 70.0;
    uVar30 = -(uint)(fVar41 <= tab_bar->ScrollingSpeed);
    fVar39 = ABS(fVar40 - fVar37) / 0.3;
    fVar41 = (float)(~uVar30 & (uint)fVar41 | (uint)tab_bar->ScrollingSpeed & uVar30);
    uVar30 = -(uint)(fVar39 <= fVar41);
    fVar39 = (float)(~uVar30 & (uint)fVar39 | uVar30 & (uint)fVar41);
    tab_bar->ScrollingSpeed = fVar39;
    fVar41 = fVar40;
    if ((pIVar19->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar38 * 10.0)) {
      fVar39 = fVar39 * (pIVar19->IO).DeltaTime;
      if (fVar40 <= fVar37) {
        fVar41 = fVar37;
        if (fVar40 < fVar37) {
          fVar37 = fVar37 - fVar39;
          uVar30 = -(uint)(fVar40 <= fVar37);
          fVar41 = (float)((uint)fVar37 & uVar30 | ~uVar30 & (uint)fVar40);
        }
      }
      else {
        fVar41 = fVar37 + fVar39;
        if (fVar40 <= fVar41) {
          fVar41 = fVar40;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar41;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  fVar37 = (tab_bar->BarRect).Max.x;
  tab_bar->ScrollingRectMinX = (tab_bar->BarRect).Min.x + sections[0].Width + fVar36;
  tab_bar->ScrollingRectMaxX = (fVar37 - sections[2].Width) - local_134;
  if ((tab_bar->Flags & 0x100000) == 0) {
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  (pIVar19->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  arrow_col.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  arrow_col.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&arrow_col,(tab_bar->FramePadding).y);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}